

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O1

void Ivy_ObjAddFanout(Ivy_Man_t *p,Ivy_Obj_t *pFanin,Ivy_Obj_t *pFanout)

{
  Ivy_Obj_t *pIVar1;
  long lVar2;
  
  if (p->fFanout == 0) {
    __assert_fail("p->fFanout",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                  ,0xb9,"void Ivy_ObjAddFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  if (pFanin->pFanout != (Ivy_Obj_t *)0x0) {
    if (((ulong)pFanin & 1) != 0) {
      __assert_fail("!Ivy_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                    ,0x3b,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    if (((ulong)pFanout & 1) != 0) {
      __assert_fail("!Ivy_IsComplement(pFanout)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                    ,0x3c,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    if ((Ivy_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe) == pFanin) {
      lVar2 = 0x28;
    }
    else {
      lVar2 = 0x30;
      if ((Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pFanin) {
        __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                      ,0x3f,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
      }
    }
    *(Ivy_Obj_t **)((long)&pFanout->Id + lVar2) = pFanin->pFanout;
    pIVar1 = pFanin->pFanout;
    if (((ulong)pIVar1 & 1) != 0) {
      __assert_fail("!Ivy_IsComplement(pFanout)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                    ,0x47,"Ivy_Obj_t **Ivy_ObjPrevFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    if ((Ivy_Obj_t *)((ulong)pIVar1->pFanin0 & 0xfffffffffffffffe) == pFanin) {
      lVar2 = 0x38;
    }
    else {
      lVar2 = 0x40;
      if ((Ivy_Obj_t *)((ulong)pIVar1->pFanin1 & 0xfffffffffffffffe) != pFanin) {
        __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                      ,0x4a,"Ivy_Obj_t **Ivy_ObjPrevFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
      }
    }
    *(Ivy_Obj_t **)((long)&pIVar1->Id + lVar2) = pFanout;
  }
  pFanin->pFanout = pFanout;
  return;
}

Assistant:

void Ivy_ObjAddFanout( Ivy_Man_t * p, Ivy_Obj_t * pFanin, Ivy_Obj_t * pFanout )
{
    assert( p->fFanout );
    if ( pFanin->pFanout )
    {
        *Ivy_ObjNextFanoutPlace(pFanin, pFanout) = pFanin->pFanout;
        *Ivy_ObjPrevFanoutPlace(pFanin, pFanin->pFanout) = pFanout;
    }
    pFanin->pFanout = pFanout;
}